

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

float FastSLog2Slow_C(uint32_t v)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  double dVar4;
  
  if (v < 0x10000) {
    uVar1 = 0x1f;
    if (v != 0) {
      for (; v >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar3 = (uVar1 ^ 0xffffffe0) + 0x19;
    bVar2 = (byte)iVar3;
    return (float)((~(-1 << (bVar2 & 0x1f)) & v) * 0x17 >> 4) +
           ((float)iVar3 + kLog2Table[v >> (bVar2 & 0x1f)]) * (float)(int)v;
  }
  dVar4 = log((double)v);
  return (float)(dVar4 * (double)v * 1.4426950408889634);
}

Assistant:

static float FastSLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const int log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    int correction = 0;
    const float v_f = (float)v;
    const uint32_t orig_v = v;
    v >>= log_cnt;
#else
    int log_cnt = 0;
    uint32_t y = 1;
    int correction = 0;
    const float v_f = (float)v;
    const uint32_t orig_v = v;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    // vf = (2^log_cnt) * Xf; where y = 2^log_cnt and Xf < 256
    // Xf = floor(Xf) * (1 + (v % y) / v)
    // log2(Xf) = log2(floor(Xf)) + log2(1 + (v % y) / v)
    // The correction factor: log(1 + d) ~ d; for very small d values, so
    // log2(1 + (v % y) / v) ~ LOG_2_RECIPROCAL * (v % y)/v
    // LOG_2_RECIPROCAL ~ 23/16
    correction = (23 * (orig_v & (y - 1))) >> 4;
    return v_f * (kLog2Table[v] + log_cnt) + correction;
  } else {
    return (float)(LOG_2_RECIPROCAL * v * log((double)v));
  }
}